

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

void __thiscall wasm::SExpressionWasmBuilder::parseExport(SExpressionWasmBuilder *this,Element *s)

{
  _Head_base<0UL,_wasm::Export_*,_false> curr;
  bool bVar1;
  Element *pEVar2;
  Element *this_00;
  Export *pEVar3;
  string *psVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  IString str;
  IString str_00;
  IString str_01;
  string_view sVar5;
  IString IVar6;
  string local_88 [32];
  string local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  allocator<char> local_29;
  _Head_base<0UL,_wasm::Export_*,_false> local_28;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> ex;
  
  std::make_unique<wasm::Export>();
  pEVar2 = Element::operator[](s,1);
  sVar5 = (string_view)Element::str(pEVar2);
  ((local_28._M_head_impl)->name).super_IString.str = sVar5;
  pEVar2 = Element::operator[](s,2);
  if (pEVar2->isList_ == true) {
    pEVar2 = Element::operator[](s,2);
    IVar6.str._M_str = extraout_RDX;
    IVar6.str._M_len = DAT_00e63bd8;
    bVar1 = elementStartsWith(pEVar2,IVar6);
    if (bVar1) {
      (local_28._M_head_impl)->kind = Function;
      pEVar2 = Element::operator[](pEVar2,1);
      sVar5 = (string_view)getFunctionName(this,pEVar2);
    }
    else {
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = MEMORY._8_8_;
      bVar1 = elementStartsWith(pEVar2,str);
      if (bVar1) {
        (local_28._M_head_impl)->kind = Memory;
        pEVar2 = Element::operator[](pEVar2,1);
        sVar5 = (string_view)Element::str(pEVar2);
      }
      else {
        str_00.str._M_str = extraout_RDX_01;
        str_00.str._M_len = TABLE._8_8_;
        bVar1 = elementStartsWith(pEVar2,str_00);
        if (bVar1) {
          (local_28._M_head_impl)->kind = Table;
          pEVar2 = Element::operator[](pEVar2,1);
          sVar5 = (string_view)getTableName(this,pEVar2);
        }
        else {
          str_01.str._M_str = extraout_RDX_02;
          str_01.str._M_len = GLOBAL._8_8_;
          bVar1 = elementStartsWith(pEVar2,str_01);
          if (bVar1) {
            (local_28._M_head_impl)->kind = Global;
            pEVar2 = Element::operator[](pEVar2,1);
            sVar5 = (string_view)getGlobalName(this,pEVar2);
          }
          else {
            this_00 = Element::operator[](pEVar2,0);
            IVar6 = Element::str(this_00);
            if (IVar6.str._M_str != (char *)TAG._8_8_) {
              psVar4 = (string *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_88,"invalid export",&local_29);
              local_48 = pEVar2->line;
              uStack_40 = pEVar2->col;
              std::__cxx11::string::string(psVar4,local_88);
              *(undefined4 *)(psVar4 + 0x20) = (undefined4)local_48;
              *(undefined4 *)(psVar4 + 0x24) = local_48._4_4_;
              *(undefined4 *)(psVar4 + 0x28) = (undefined4)uStack_40;
              *(undefined4 *)(psVar4 + 0x2c) = uStack_40._4_4_;
              __cxa_throw(psVar4,&ParseException::typeinfo,ParseException::~ParseException);
            }
            (local_28._M_head_impl)->kind = Tag;
            pEVar2 = Element::operator[](pEVar2,1);
            sVar5 = (string_view)getTagName(this,pEVar2);
          }
        }
      }
    }
    ((local_28._M_head_impl)->value).super_IString.str = sVar5;
  }
  else {
    pEVar2 = Element::operator[](s,2);
    sVar5 = (string_view)Element::str(pEVar2);
    ((local_28._M_head_impl)->value).super_IString.str = sVar5;
    (local_28._M_head_impl)->kind = Function;
  }
  pEVar3 = Module::getExportOrNull
                     (this->wasm,(Name)((local_28._M_head_impl)->name).super_IString.str);
  curr._M_head_impl = local_28._M_head_impl;
  if (pEVar3 == (Export *)0x0) {
    local_28._M_head_impl = (Export *)0x0;
    Module::addExport(this->wasm,curr._M_head_impl);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_28);
    return;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"duplicate export",&local_29);
  local_48 = s->line;
  uStack_40 = s->col;
  std::__cxx11::string::string(psVar4,local_68);
  *(undefined4 *)(psVar4 + 0x20) = (undefined4)local_48;
  *(undefined4 *)(psVar4 + 0x24) = local_48._4_4_;
  *(undefined4 *)(psVar4 + 0x28) = (undefined4)uStack_40;
  *(undefined4 *)(psVar4 + 0x2c) = uStack_40._4_4_;
  __cxa_throw(psVar4,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void SExpressionWasmBuilder::parseExport(Element& s) {
  std::unique_ptr<Export> ex = std::make_unique<Export>();
  ex->name = s[1]->str();
  if (s[2]->isList()) {
    auto& inner = *s[2];
    if (elementStartsWith(inner, FUNC)) {
      ex->kind = ExternalKind::Function;
      ex->value = getFunctionName(*inner[1]);
    } else if (elementStartsWith(inner, MEMORY)) {
      ex->kind = ExternalKind::Memory;
      ex->value = inner[1]->str();
    } else if (elementStartsWith(inner, TABLE)) {
      ex->kind = ExternalKind::Table;
      ex->value = getTableName(*inner[1]);
    } else if (elementStartsWith(inner, GLOBAL)) {
      ex->kind = ExternalKind::Global;
      ex->value = getGlobalName(*inner[1]);
    } else if (inner[0]->str() == TAG) {
      ex->kind = ExternalKind::Tag;
      ex->value = getTagName(*inner[1]);
    } else {
      throw ParseException("invalid export", inner.line, inner.col);
    }
  } else {
    // function
    ex->value = s[2]->str();
    ex->kind = ExternalKind::Function;
  }
  if (wasm.getExportOrNull(ex->name)) {
    throw ParseException("duplicate export", s.line, s.col);
  }
  wasm.addExport(ex.release());
}